

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adhuff_common.c
# Opt level: O0

void hash_release(void)

{
  hash_entry *phVar1;
  hash_entry_t *next;
  hash_entry_t *entry;
  int i;
  
  for (entry._4_4_ = 0; entry._4_4_ < map_weight_nodes.length; entry._4_4_ = entry._4_4_ + 1) {
    next = map_weight_nodes.buckets[entry._4_4_];
    while (next != (hash_entry_t *)0x0) {
      phVar1 = next->next;
      free(next);
      next = phVar1;
    }
  }
  return;
}

Assistant:

void hash_release() {
    for (int i = 0; i < map_weight_nodes.length; ++i) {
        hash_entry_t  *entry = map_weight_nodes.buckets[i];
        while(entry) {
            hash_entry_t  *next = entry->next;
            free(entry);
            entry = next;
        }
    }
    //moved to stack with fixed size
    //free(map_weight_nodes.buckets);

#ifdef _DEBUG
    fprintf(stdout, "total number of collision: %ld\n", collision);
    collision = 0;
#endif
}